

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O3

SWDBit * __thiscall SWDParser::ParseBit(SWDBit *__return_storage_ptr__,SWDParser *this)

{
  AnalyzerChannelData *pAVar1;
  int iVar2;
  BitState BVar3;
  S64 SVar4;
  
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 0) {
    SVar4 = AnalyzerChannelData::GetSampleNumber();
    __return_storage_ptr__->low_start = SVar4;
    pAVar1 = this->mSWCLK;
    AnalyzerChannelData::GetSampleOfNextEdge();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    pAVar1 = this->mSWDIO;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    SVar4 = AnalyzerChannelData::GetSampleNumber();
    __return_storage_ptr__->rising = SVar4;
    BVar3 = AnalyzerChannelData::GetBitState();
    __return_storage_ptr__->state_rising = BVar3;
    AnalyzerChannelData::AdvanceToNextEdge();
    pAVar1 = this->mSWDIO;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    AnalyzerChannelData::AdvanceToNextEdge();
    pAVar1 = this->mSWDIO;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    SVar4 = AnalyzerChannelData::GetSampleNumber();
    __return_storage_ptr__->falling = SVar4;
    BVar3 = AnalyzerChannelData::GetBitState();
    __return_storage_ptr__->state_falling = BVar3;
    SVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
    __return_storage_ptr__->low_end = SVar4;
    return __return_storage_ptr__;
  }
  __assert_fail("mSWCLK->GetBitState() == BIT_LOW",
                "/workspace/llm4binary/github/license_c_cmakelists/saleae[P]swd-analyzer/src/SWDTypes.cpp"
                ,0x108,"SWDBit SWDParser::ParseBit()");
}

Assistant:

SWDBit SWDParser::ParseBit()
{
    SWDBit rbit;

    assert( mSWCLK->GetBitState() == BIT_LOW );

    rbit.low_start = mSWCLK->GetSampleNumber();

    // sample the rising edge 1 sample before the the actual
    mSWCLK->AdvanceToAbsPosition( mSWCLK->GetSampleOfNextEdge() - 1 );
    mSWDIO->AdvanceToAbsPosition( mSWCLK->GetSampleNumber() );
    rbit.rising = mSWCLK->GetSampleNumber();
    rbit.state_rising = mSWDIO->GetBitState();
    mSWCLK->AdvanceToNextEdge();
    mSWDIO->AdvanceToAbsPosition( mSWCLK->GetSampleNumber() );

    /*
    // go to the rising egde
    mSWCLK->AdvanceToNextEdge();
    mSWDIO->AdvanceToAbsPosition(mSWCLK->GetSampleNumber());

    rbit.rising = mSWCLK->GetSampleNumber();
    rbit.state_rising = mSWDIO->GetBitState();
    */

    // go to the falling edge
    mSWCLK->AdvanceToNextEdge();
    mSWDIO->AdvanceToAbsPosition( mSWCLK->GetSampleNumber() );

    rbit.falling = mSWCLK->GetSampleNumber();
    rbit.state_falling = mSWDIO->GetBitState();

    rbit.low_end = mSWCLK->GetSampleOfNextEdge();

    return rbit;
}